

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall chrono::utils::ChChaseCamera::Raise(ChChaseCamera *this,int val)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 local_18 [16];
  double local_8;
  
  if ((val != 0) && (this->m_state == Free)) {
    if (val < 0) {
      auVar2._8_8_ = 0x3f847ae147ae147b;
      auVar2._0_8_ = 0x3f847ae147ae147b;
      local_18 = vmulpd_avx512vl(*(undefined1 (*) [16])(this->m_up).m_data,auVar2);
      local_8 = (this->m_up).m_data[2] * 0.01;
      ChVector<double>::operator+=(&this->m_loc,(ChVector<double> *)local_18);
    }
    else {
      auVar1._8_8_ = 0x3f847ae147ae147b;
      auVar1._0_8_ = 0x3f847ae147ae147b;
      local_18 = vmulpd_avx512vl(*(undefined1 (*) [16])(this->m_up).m_data,auVar1);
      local_8 = (this->m_up).m_data[2] * 0.01;
      ChVector<double>::operator-=(&this->m_loc,(ChVector<double> *)local_18);
    }
  }
  return;
}

Assistant:

void ChChaseCamera::Raise(int val) {
    if (val == 0 || m_state != Free)
        return;

    if (val < 0)
        m_loc += 0.01 * m_up;
    else
        m_loc -= 0.01 * m_up;
}